

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O0

void __thiscall HuffTree::HuffTree(HuffTree *this)

{
  TreeNode *in_RDI;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>
  *in_stack_ffffffffffffff98;
  TreeNode *__args;
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *this_00;
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  *(__uniq_ptr_data<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>,_true,_true> *)
   in_RDI = (__uniq_ptr_data<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>,_true,_true>
             )0x0;
  __args = (TreeNode *)&in_RDI->_left;
  std::unique_ptr<HuffTree::TreeNode,std::default_delete<HuffTree::TreeNode>>::
  unique_ptr<std::default_delete<HuffTree::TreeNode>,void>
            ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)in_RDI);
  local_28 = 0;
  uStack_20 = 0;
  local_38._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
       (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
       (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
  uStack_30 = 0;
  this_00 = &local_38;
  TreeNode::TreeNode(in_RDI);
  std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>(__args);
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::operator=
            ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)in_RDI,
             in_stack_ffffffffffffff98);
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
            ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)this_00);
  TreeNode::~TreeNode(in_RDI);
  return;
}

Assistant:

HuffTree::HuffTree() {
    root = std::make_unique<TreeNode>(TreeNode());
}